

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O1

int Curl_fnmatch(void *ptr,char *pattern,char *string)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 2;
  if (string != (char *)0x0 && pattern != (char *)0x0) {
    iVar1 = fnmatch(pattern,string,0);
    iVar2 = (iVar1 != 1) + 1;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int Curl_fnmatch(void *ptr, const char *pattern, const char *string)
{
  (void)ptr; /* the argument is specified by the curl_fnmatch_callback
                prototype, but not used by Curl_fnmatch() */
  if(!pattern || !string) {
    return CURL_FNMATCH_FAIL;
  }

  switch(fnmatch(pattern, string, 0)) {
  case 0:
    return CURL_FNMATCH_MATCH;
  case FNM_NOMATCH:
    return CURL_FNMATCH_NOMATCH;
  default:
    return CURL_FNMATCH_FAIL;
  }
  /* not reached */
}